

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.hpp
# Opt level: O2

void __thiscall
optimization::sanity_check::SanityCheck::optimize_func(SanityCheck *this,MirFunction *func)

{
  _Base_ptr p_Var1;
  long *plVar2;
  undefined **ppuVar3;
  long lVar4;
  variant_alternative_t<0UL,_variant<VarId,_basic_string<char>_>_> *pvVar5;
  _Base_ptr p_Var6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  Value *pVVar9;
  Value *pVVar10;
  long lVar11;
  _Base_ptr p_Var12;
  anon_class_8_1_a7bdd428 check_val;
  anon_class_8_1_898bcfc2 check;
  undefined1 local_210 [24];
  undefined1 local_1f8;
  undefined2 local_1f7;
  VarId local_1f0;
  undefined1 local_1e0 [16];
  uint32_t local_1d0;
  undefined1 local_1c8;
  undefined2 local_1c7;
  VarId local_1c0;
  Value local_1b0;
  Value local_190;
  Value local_170;
  Value local_150;
  Value local_130;
  Value local_110;
  Value local_f0;
  Value local_d0;
  Value local_b0;
  Value v;
  Value local_70;
  Value local_50;
  
  check_val.check = &check;
  p_Var6 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  check.func = func;
  do {
    if ((_Rb_tree_header *)p_Var6 == &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    p_Var1 = p_Var6[3]._M_left;
    for (p_Var12 = p_Var6[3]._M_parent; p_Var12 != p_Var1; p_Var12 = (_Base_ptr)&p_Var12->_M_parent)
    {
      plVar2 = *(long **)p_Var12;
      local_1c0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_1c0.id = *(uint32_t *)(plVar2 + 2);
      optimize_func::anon_class_8_1_898bcfc2::operator()(&check,&local_1c0,p_Var6[1]._M_color);
      ppuVar3 = (undefined **)*plVar2;
      if (ppuVar3 == &PTR_display_001db058) {
        mir::inst::Value::Value(&local_50,(Value *)(plVar2 + 3));
        optimize_func::anon_class_8_1_a7bdd428::operator()(&check_val,&local_50,p_Var6[1]._M_color);
        pVVar10 = (Value *)(plVar2 + 7);
        pVVar9 = &local_70;
        goto LAB_00119188;
      }
      if (ppuVar3 == &PTR_display_001db118) {
        pVVar10 = (Value *)plVar2[8];
        for (pVVar9 = (Value *)plVar2[7]; pVVar9 != pVVar10; pVVar9 = pVVar9 + 1) {
          mir::inst::Value::Value(&v,pVVar9);
          mir::inst::Value::Value(&local_b0,&v);
          optimize_func::anon_class_8_1_a7bdd428::operator()
                    (&check_val,&local_b0,p_Var6[1]._M_color);
        }
        goto LAB_001191a8;
      }
      if (ppuVar3 == &PTR_display_001daff8) {
        pVVar10 = (Value *)(plVar2 + 3);
        pVVar9 = &local_d0;
LAB_00119188:
        mir::inst::Value::Value(pVVar9,pVVar10);
LAB_0011919e:
        optimize_func::anon_class_8_1_a7bdd428::operator()(&check_val,pVVar9,p_Var6[1]._M_color);
      }
      else {
        if (ppuVar3 == &PTR_display_001db1d8) {
          pVVar10 = (Value *)(plVar2 + 3);
          pVVar9 = &local_f0;
          goto LAB_00119188;
        }
        if (ppuVar3 == &PTR_display_001db298) {
          pVVar10 = (Value *)(plVar2 + 3);
          pVVar9 = &local_110;
          goto LAB_00119188;
        }
        if (ppuVar3 == &PTR_display_001db238) {
          mir::inst::Value::Value(&local_130,(Value *)(plVar2 + 3));
          optimize_func::anon_class_8_1_a7bdd428::operator()
                    (&check_val,&local_130,p_Var6[1]._M_color);
          pVVar10 = (Value *)(plVar2 + 7);
          pVVar9 = &local_150;
          goto LAB_00119188;
        }
        if (ppuVar3 == &PTR_display_001db2f8) {
          mir::inst::Value::Value(&local_170,(Value *)(plVar2 + 3));
          optimize_func::anon_class_8_1_a7bdd428::operator()
                    (&check_val,&local_170,p_Var6[1]._M_color);
          pVVar10 = (Value *)(plVar2 + 7);
          pVVar9 = &local_190;
          goto LAB_00119188;
        }
        if (ppuVar3 == &PTR_display_001db178) {
          if ((char)plVar2[7] != '\0') goto LAB_001191a8;
          pvVar5 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                             ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(plVar2 + 3));
          local_1d0 = pvVar5->id;
          local_1e0._8_8_ = &PTR_display_001d90d0;
          local_1c8 = 1;
          local_1e0._0_8_ = &PTR_display_001dafa8;
          local_1c7._0_1_ = Lsl;
          local_1c7._1_1_ = '\0';
          pVVar9 = (Value *)local_1e0;
          goto LAB_0011919e;
        }
        if (ppuVar3 != &PTR_display_001db3b8) {
          if (ppuVar3 != &PTR_display_001db358) {
            puVar7 = (undefined8 *)__cxa_allocate_exception(8);
            puVar8 = (undefined8 *)operator_new(8);
            *puVar8 = std::_Rb_tree_rebalance_for_erase;
            *puVar7 = puVar8;
            __cxa_throw(puVar7,&std::bad_cast*::typeinfo,0);
          }
          local_210._16_4_ = *(undefined4 *)(plVar2 + 4);
          local_210._8_8_ = &PTR_display_001d90d0;
          local_1f8 = 1;
          local_210._0_8_ = &PTR_display_001dafa8;
          local_1f7._0_1_ = Lsl;
          local_1f7._1_1_ = '\0';
          optimize_func::anon_class_8_1_a7bdd428::operator()
                    (&check_val,(Value *)local_210,p_Var6[1]._M_color);
          pVVar10 = (Value *)(plVar2 + 5);
          pVVar9 = &local_1b0;
          goto LAB_00119188;
        }
        lVar4 = plVar2[6];
        for (lVar11 = plVar2[5]; lVar11 != lVar4; lVar11 = lVar11 + 0x10) {
          local_1f0.id = *(uint32_t *)(lVar11 + 8);
          local_1f0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          optimize_func::anon_class_8_1_898bcfc2::operator()(&check,&local_1f0,p_Var6[1]._M_color);
        }
      }
LAB_001191a8:
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

void optimize_func(mir::inst::MirFunction &func) {
    auto check = [&](mir::inst::VarId id, int bb) {
      if (func.variables.find(id) == func.variables.end()) {
        LOG(FATAL) << "No such variable: " << id << " (in: " << func.name
                   << ", bb " << bb << ")" << std::endl;
        func.variables.insert(
            {id.id, mir::inst::Variable(mir::types::new_int_ty())});
        // failed = true;
      }
    };
    auto check_val = [&](mir::inst::Value val, int bb) {
      if (auto id = val.get_if<mir::inst::VarId>()) {
        check(*id, bb);
      }
    };
    for (auto &bb : func.basic_blks) {
      for (auto &inst : bb.second.inst) {
        auto &i = *inst;
        check(i.dest, bb.first);
        if (auto x = dynamic_cast<mir::inst::OpInst *>(&i)) {
          check_val(x->lhs, bb.first);
          check_val(x->rhs, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::CallInst *>(&i)) {
          for (auto v : x->params) check_val(v, bb.first);

        } else if (auto x = dynamic_cast<mir::inst::AssignInst *>(&i)) {
          check_val(x->src, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::LoadInst *>(&i)) {
          check_val(x->src, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::StoreInst *>(&i)) {
          check_val(x->val, bb.first);

        } else if (auto x = dynamic_cast<mir::inst::LoadOffsetInst *>(&i)) {
          check_val(x->src, bb.first);
          check_val(x->offset, bb.first);

        } else if (auto x = dynamic_cast<mir::inst::StoreOffsetInst *>(&i)) {
          check_val(x->val, bb.first);
          check_val(x->offset, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::RefInst *>(&i)) {
          if (x->val.index() == 0)
            check_val(std::get<0>(x->val), bb.first);
          else {
          }
        } else if (auto x = dynamic_cast<mir::inst::PhiInst *>(&i)) {
          for (auto v : x->vars) check(v, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::PtrOffsetInst *>(&i)) {
          check_val(x->ptr, bb.first);
          check_val(x->offset, bb.first);
        } else {
          throw new std::bad_cast();
        }
      }
    }
  }